

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountAggregate.cpp
# Opt level: O0

void __thiscall CountAggregate::~CountAggregate(CountAggregate *this)

{
  void *in_RDI;
  CountAggregate *in_stack_00000070;
  
  ~CountAggregate(in_stack_00000070);
  operator_delete(in_RDI);
  return;
}

Assistant:

CountAggregate::~CountAggregate()
{
    for (size_t i = 0; i < NUM_OF_FEATURES; ++i)
        delete[] _features[i];
    delete[] _features;

    for (size_t i = 0; i < _aggregateRegister.size(); ++i)
        for (size_t j = 0; j < _aggregateRegister[i].size(); ++j)
            delete[] _aggregateRegister[i][j];

    delete[] _numberOfAggregatesPerNode;
    delete[] _degreeOfLocalAggregates;
    
    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
    {
        if (i != (size_t) _dTree->_root->_id)
        {
            delete[] aggPlaceholder[i];
            delete[] lineagePlaceholder[i];
        }
    }

    delete[] aggPlaceholder;
    delete[] lineagePlaceholder;
    delete[] _cofactorMatrix;
}